

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O1

long do_single_probe(CMConnection conn,long size,attr_list attrs)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  char *pcVar5;
  long lVar6;
  pthread_t pVar7;
  size_t size_00;
  double dVar8;
  chr_time round_trip_time;
  FFSEncodeVec tmp_vec [1];
  timespec ts_1;
  chr_time local_60;
  FFSEncodeVec local_48;
  timespec local_38;
  
  iVar2 = INT_CMCondition_get(conn->cm,conn);
  size_00 = 0xc;
  if (0xc < size) {
    size_00 = size;
  }
  if (do_single_probe::max_block_size == 0) {
    pcVar5 = (char *)INT_CMmalloc(size_00);
  }
  else {
    if ((long)size_00 <= do_single_probe::max_block_size) goto LAB_00125382;
    pcVar5 = (char *)INT_CMrealloc(do_single_probe::block,size_00);
  }
  if (pcVar5 == (char *)0x0) {
    return -1;
  }
  do_single_probe::max_block_size = size_00;
  do_single_probe::block = pcVar5;
  memset(pcVar5,0xef,size_00);
LAB_00125382:
  pcVar5 = do_single_probe::block;
  pcVar5[0] = '\0';
  pcVar5[1] = 'P';
  pcVar5[2] = 'M';
  pcVar5[3] = 'C';
  *(uint *)(pcVar5 + 4) = (uint)(size_00 >> 0x20) & 0xffffff;
  *(int *)(pcVar5 + 8) = (int)size_00;
  *(int *)(pcVar5 + 0xc) = iVar2;
  INT_CMCondition_set_client_data(conn->cm,iVar2,&local_60);
  iVar3 = CMtrace_val[5];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(conn->cm,CMTransportVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)conn->cm->CMTrace_file;
      _Var4 = getpid();
      pVar7 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar7);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&local_48);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_48.iov_base,local_48.iov_len);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,"CM - Initiating latency probe of %ld bytes\n",size_00);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  chr_timer_start(&local_60);
  local_48.iov_base = do_single_probe::block;
  local_48.iov_len = size_00;
  iVar3 = INT_CMwrite_raw(conn,&local_48,(FFSEncodeVector)0x0,1,size_00,(attr_list)0x0,0);
  lVar6 = -1;
  if (iVar3 == 1) {
    INT_CMCondition_wait(conn->cm,iVar2);
    iVar2 = CMtrace_val[5];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(conn->cm,CMTransportVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)conn->cm->CMTrace_file;
        _Var4 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_38);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
      }
      pFVar1 = (FILE *)conn->cm->CMTrace_file;
      chr_time_to_microsecs(&local_60);
      fprintf(pFVar1,"CM - Completed latency probe - result %g microseconds\n");
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    dVar8 = chr_time_to_microsecs(&local_60);
    lVar6 = (long)dVar8;
  }
  return lVar6;
}

Assistant:

static long
do_single_probe(CMConnection conn, long size, attr_list attrs)
{
    int cond;
    static long max_block_size = 0;
    static char *block = NULL;
    chr_time round_trip_time;
    long actual;
    struct FFSEncodeVec tmp_vec[1];

    (void)attrs;
    cond = INT_CMCondition_get(conn->cm, conn);

    if (size < 12) size = 12;
    if (max_block_size == 0) {
	char *new_block = malloc(size);
	if (new_block == NULL) return -1;
	block = new_block;
	max_block_size = size;
	memset(block, 0xef, size);
    } else if (size > max_block_size) {
	char *new_block = realloc(block, size);
	if (new_block == NULL) return -1;
	block = new_block;
	max_block_size = size;
	memset(block, 0xef, size);
    }
    
    /* CMP\0 in first entry for CMPerformance message */
    ((int*)block)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
    ((int*)block)[1] = (size & 0xffffff) | (CMPerfProbe<<24);;
    ((int*)block)[2] = 0;
#else
    ((int*)block)[1] = (size >>32) & 0xffffff;
    ((int*)block)[2] = size;
#endif
    ((int*)block)[3] = cond;   /* condition value in fourth entry */
    
    INT_CMCondition_set_client_data( conn->cm, cond, &round_trip_time);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Initiating latency probe of %ld bytes\n", size);
    chr_timer_start(&round_trip_time);

    tmp_vec[0].iov_base = &block[0];
    tmp_vec[0].iov_len = size;
    actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, size, NULL, 0);

    if (actual != 1) return -1;

    INT_CMCondition_wait(conn->cm, cond);
    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Completed latency probe - result %g microseconds\n", chr_time_to_microsecs(&round_trip_time));
    return (long) chr_time_to_microsecs(&round_trip_time);
}